

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  long lVar1;
  long lVar2;
  secp256k1_fe *b;
  secp256k1_ge *r;
  secp256k1_fe zs;
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  lVar1 = len - 1;
  if (len != 0) {
    secp256k1_fe_impl_normalize_weak(&a[lVar1].y);
    local_a8.n[4] = zr[lVar1].n[4];
    local_a8.n[0] = zr[lVar1].n[0];
    local_a8.n[1] = zr[lVar1].n[1];
    local_a8.n[2] = zr[lVar1].n[2];
    local_a8.n[3] = (zr[lVar1].n + 2)[1];
    b = zr + len;
    r = a + (len - 2);
    for (lVar2 = 0; b = b + -1, lVar1 != lVar2; lVar2 = lVar2 + 1) {
      if (lVar2 != 0) {
        secp256k1_fe_impl_mul(&local_a8,&local_a8,b);
      }
      secp256k1_fe_impl_sqr(&local_58,&local_a8);
      secp256k1_fe_impl_mul(&local_80,&local_58,&local_a8);
      secp256k1_fe_impl_mul(&r->x,&r->x,&local_58);
      secp256k1_fe_impl_mul(&r->y,&r->y,&local_80);
      r = r + -1;
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i = len - 1;
    secp256k1_fe zs;

    if (len > 0) {
        /* Verify inputs a[len-1] and zr[len-1]. */
        secp256k1_ge_verify(&a[i]);
        secp256k1_fe_verify(&zr[i]);
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            /* Verify all inputs a[i] and zr[i]. */
            secp256k1_fe_verify(&zr[i]);
            secp256k1_ge_verify(&a[i]);
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_ge_zinv(&a[i], &a[i], &zs);
            /* Verify the output a[i]. */
            secp256k1_ge_verify(&a[i]);
        }
    }
}